

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_addsessionid
                   (Curl_cfilter *cf,Curl_easy *data,void *ssl_sessionid,size_t idsize,_Bool *added)

{
  void *pvVar1;
  _Bool _Var2;
  ssl_primary_config *source;
  char *pcVar3;
  bool bVar4;
  long *local_88;
  long *general_age;
  char *pcStack_78;
  int conn_to_port;
  char *clone_conn_to_host;
  char *clone_host;
  long oldest_age;
  Curl_ssl_session *store;
  size_t i;
  ssl_primary_config *conn_config;
  ssl_config_data *ssl_config;
  ssl_connect_data *connssl;
  _Bool *added_local;
  size_t idsize_local;
  void *ssl_sessionid_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  Curl_ssl_cf_get_config(cf,data);
  source = Curl_ssl_cf_get_primary_config(cf);
  if (added != (_Bool *)0x0) {
    *added = false;
  }
  if ((data->state).session == (Curl_ssl_session *)0x0) {
    cf_local._4_4_ = CURLE_OK;
  }
  else {
    oldest_age = (long)(data->state).session;
    clone_host = (char *)((data->state).session)->age;
    pcVar3 = (*Curl_cstrdup)(*(char **)((long)pvVar1 + 8));
    if (pcVar3 == (char *)0x0) {
      cf_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      if (((uint)cf->conn->bits >> 9 & 1) == 0) {
        pcStack_78 = (char *)0x0;
      }
      else {
        pcStack_78 = (*Curl_cstrdup)((cf->conn->conn_to_host).name);
        if (pcStack_78 == (char *)0x0) {
          (*Curl_cfree)(pcVar3);
          return CURLE_OUT_OF_MEMORY;
        }
      }
      if (((uint)cf->conn->bits >> 10 & 1) == 0) {
        general_age._4_4_ = -1;
      }
      else {
        general_age._4_4_ = cf->conn->conn_to_port;
      }
      if ((data->share == (Curl_share *)0x0) || ((data->share->specifier & 0x10) == 0)) {
        local_88 = &(data->state).sessionage;
      }
      else {
        local_88 = &data->share->sessionage;
      }
      store = (Curl_ssl_session *)0x1;
      while( true ) {
        bVar4 = false;
        if (store < (Curl_ssl_session *)(data->set).general_ssl.max_ssl_sessions) {
          bVar4 = (data->state).session[(long)store].sessionid != (void *)0x0;
        }
        if (!bVar4) break;
        if ((data->state).session[(long)store].age < (long)clone_host) {
          clone_host = (char *)(data->state).session[(long)store].age;
          oldest_age = (long)((data->state).session + (long)store);
        }
        store = (Curl_ssl_session *)((long)&store->name + 1);
      }
      if (store == (Curl_ssl_session *)(data->set).general_ssl.max_ssl_sessions) {
        Curl_ssl_kill_session((Curl_ssl_session *)oldest_age);
      }
      else {
        oldest_age = (long)((data->state).session + (long)store);
      }
      *(void **)(oldest_age + 0x18) = ssl_sessionid;
      *(size_t *)(oldest_age + 0x20) = idsize;
      *(long *)(oldest_age + 0x28) = *local_88;
      (*Curl_cfree)(*(void **)oldest_age);
      (*Curl_cfree)(*(void **)(oldest_age + 8));
      *(char **)oldest_age = pcVar3;
      *(char **)(oldest_age + 8) = pcStack_78;
      *(int *)(oldest_age + 0x34) = general_age._4_4_;
      *(undefined4 *)(oldest_age + 0x30) = *(undefined4 *)((long)pvVar1 + 0x50);
      *(char **)(oldest_age + 0x10) = cf->conn->handler->scheme;
      _Var2 = clone_ssl_primary_config(source,(ssl_primary_config *)(oldest_age + 0x38));
      if (_Var2) {
        if (added != (_Bool *)0x0) {
          *added = true;
        }
        cf_local._4_4_ = CURLE_OK;
      }
      else {
        Curl_free_primary_ssl_config((ssl_primary_config *)(oldest_age + 0x38));
        *(undefined8 *)(oldest_age + 0x18) = 0;
        (*Curl_cfree)(pcVar3);
        (*Curl_cfree)(pcStack_78);
        cf_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
    }
  }
  return cf_local._4_4_;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               void *ssl_sessionid,
                               size_t idsize,
                               bool *added)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  size_t i;
  struct Curl_ssl_session *store;
  long oldest_age;
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;

  if(added)
    *added = FALSE;

  if(!data->state.session)
    return CURLE_OK;

  store = &data->state.session[0];
  oldest_age = data->state.session[0].age; /* zero if unused */
  (void)ssl_config;
  DEBUGASSERT(ssl_config->primary.sessionid);

  clone_host = strdup(connssl->peer.hostname);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(cf->conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(cf->conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(cf->conn->bits.conn_to_port)
    conn_to_port = cf->conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.general_ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.general_ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
  /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  /* port number */
  store->remote_port = connssl->port;
  store->scheme = cf->conn->handler->scheme;

  if(!clone_ssl_primary_config(conn_config, &store->ssl_config)) {
    Curl_free_primary_ssl_config(&store->ssl_config);
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  if(added)
    *added = TRUE;

  DEBUGF(infof(data, "Added Session ID to cache for %s://%s:%d [%s]",
               store->scheme, store->name, store->remote_port,
               Curl_ssl_cf_is_proxy(cf) ? "PROXY" : "server"));
  return CURLE_OK;
}